

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_disk_posix.c
# Opt level: O0

wchar_t cleanup_pathname_fsobj(char *path,wchar_t *a_eno,archive_string *a_estr,wchar_t flags)

{
  bool bVar1;
  char local_41;
  char *pcStack_40;
  char separator;
  char *src;
  char *dest;
  wchar_t flags_local;
  archive_string *a_estr_local;
  wchar_t *a_eno_local;
  char *path_local;
  
  local_41 = '\0';
  if (*path == '\0') {
    fsobj_error(a_eno,a_estr,L'\xffffffff',"Invalid empty ","pathname");
    return L'\xffffffe7';
  }
  pcStack_40 = path;
  src = path;
  if (*path == '/') {
    if ((flags & 0x10000U) != 0) {
      fsobj_error(a_eno,a_estr,L'\xffffffff',"Path is ","absolute");
      return L'\xffffffe7';
    }
    pcStack_40 = path + 1;
    local_41 = *path;
  }
  while (*pcStack_40 != '\0') {
    if (*pcStack_40 == '/') {
      pcStack_40 = pcStack_40 + 1;
    }
    else if (*pcStack_40 == '.') {
      if (pcStack_40[1] == '\0') break;
      if (pcStack_40[1] != '/') {
        if ((pcStack_40[1] == '.') &&
           (((pcStack_40[2] == '/' || (pcStack_40[2] == '\0')) && ((flags & 0x200U) != 0)))) {
          fsobj_error(a_eno,a_estr,L'\xffffffff',"Path contains ","\'..\'");
          return L'\xffffffe7';
        }
        goto LAB_001c75e0;
      }
      pcStack_40 = pcStack_40 + 2;
    }
    else {
LAB_001c75e0:
      if (local_41 != '\0') {
        *src = '/';
        src = src + 1;
      }
      while( true ) {
        bVar1 = false;
        if (*pcStack_40 != '\0') {
          bVar1 = *pcStack_40 != '/';
        }
        if (!bVar1) break;
        *src = *pcStack_40;
        pcStack_40 = pcStack_40 + 1;
        src = src + 1;
      }
      if (*pcStack_40 == '\0') break;
      local_41 = *pcStack_40;
      pcStack_40 = pcStack_40 + 1;
    }
  }
  if (src == path) {
    if (local_41 == '\0') {
      *src = '.';
    }
    else {
      *src = '/';
    }
    src = src + 1;
  }
  *src = '\0';
  return L'\0';
}

Assistant:

static int
cleanup_pathname_fsobj(char *path, int *a_eno, struct archive_string *a_estr,
    int flags)
{
	char *dest, *src;
	char separator = '\0';

	dest = src = path;
	if (*src == '\0') {
		fsobj_error(a_eno, a_estr, ARCHIVE_ERRNO_MISC,
		    "Invalid empty ", "pathname");
		return (ARCHIVE_FAILED);
	}

#if defined(__CYGWIN__)
	cleanup_pathname_win(path);
#endif
	/* Skip leading '/'. */
	if (*src == '/') {
		if (flags & ARCHIVE_EXTRACT_SECURE_NOABSOLUTEPATHS) {
			fsobj_error(a_eno, a_estr, ARCHIVE_ERRNO_MISC,
			    "Path is ", "absolute");
			return (ARCHIVE_FAILED);
		}

		separator = *src++;
	}

	/* Scan the pathname one element at a time. */
	for (;;) {
		/* src points to first char after '/' */
		if (src[0] == '\0') {
			break;
		} else if (src[0] == '/') {
			/* Found '//', ignore second one. */
			src++;
			continue;
		} else if (src[0] == '.') {
			if (src[1] == '\0') {
				/* Ignore trailing '.' */
				break;
			} else if (src[1] == '/') {
				/* Skip './'. */
				src += 2;
				continue;
			} else if (src[1] == '.') {
				if (src[2] == '/' || src[2] == '\0') {
					/* Conditionally warn about '..' */
					if (flags
					    & ARCHIVE_EXTRACT_SECURE_NODOTDOT) {
						fsobj_error(a_eno, a_estr,
						    ARCHIVE_ERRNO_MISC,
						    "Path contains ", "'..'");
						return (ARCHIVE_FAILED);
					}
				}
				/*
				 * Note: Under no circumstances do we
				 * remove '..' elements.  In
				 * particular, restoring
				 * '/foo/../bar/' should create the
				 * 'foo' dir as a side-effect.
				 */
			}
		}

		/* Copy current element, including leading '/'. */
		if (separator)
			*dest++ = '/';
		while (*src != '\0' && *src != '/') {
			*dest++ = *src++;
		}

		if (*src == '\0')
			break;

		/* Skip '/' separator. */
		separator = *src++;
	}
	/*
	 * We've just copied zero or more path elements, not including the
	 * final '/'.
	 */
	if (dest == path) {
		/*
		 * Nothing got copied.  The path must have been something
		 * like '.' or '/' or './' or '/././././/./'.
		 */
		if (separator)
			*dest++ = '/';
		else
			*dest++ = '.';
	}
	/* Terminate the result. */
	*dest = '\0';
	return (ARCHIVE_OK);
}